

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

void __thiscall
UnicodeFullTest_string_cast_Test<std::pair<char,_char8_t>_>::TestBody
          (UnicodeFullTest_string_cast_Test<std::pair<char,_char8_t>_> *this)

{
  char32_t (*in_RDX) [5];
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *pcVar1;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *pcVar2;
  _Alloc_hider _Var3;
  pointer *__ptr;
  _Alloc_hider _Var4;
  pointer *__ptr_3;
  jessilib *this_00;
  pointer *__ptr_2;
  bool bVar5;
  decode_result dVar6;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_01;
  basic_string_view<char,_std::char_traits<char>_> in_string_02;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> lhs_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> rhs;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> rhs_00;
  AssertionResult gtest_ar_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abcd_str;
  long *local_90;
  AssertHelper local_88 [8];
  long *local_80;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  long local_70 [2];
  char local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char *extraout_RDX;
  char *extraout_RDX_05;
  
  jessilib::string_cast<char,char32_t[5]>(&local_50,(jessilib *)L"ABCD",in_RDX);
  this_00 = (jessilib *)local_50._M_string_length;
  _Var3._M_p = local_50._M_dataplus._M_p;
  pcVar2 = local_50._M_dataplus._M_p + local_50._M_string_length;
  local_80 = local_70;
  std::__cxx11::u8string::_M_construct<char8_t_const*>
            ((u8string *)&local_80,local_50._M_dataplus._M_p,pcVar2);
  lhs._M_str = local_50._M_dataplus._M_p;
  lhs._M_len = local_50._M_string_length;
  rhs._M_str = (char8_t *)local_80;
  rhs._M_len = (size_t)local_78._M_head_impl;
  local_60[0] = jessilib::equals<char,char8_t>(lhs,rhs);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pcVar1 = extraout_RDX;
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
    pcVar1 = extraout_RDX_00;
  }
  if (local_60[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_80,local_60,
               "equals(abcd_str, string_cast<typename TypeParam::second_type>(abcd_str))","false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x9d,(char *)local_80);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    pcVar1 = extraout_RDX_01;
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
      pcVar1 = extraout_RDX_02;
    }
    if (local_90 != (long *)0x0) {
      (**(code **)(*local_90 + 8))();
      pcVar1 = extraout_RDX_03;
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
    pcVar1 = extraout_RDX_04;
  }
  _Var4._M_p = local_50._M_dataplus._M_p;
  bVar5 = (jessilib *)local_50._M_string_length == (jessilib *)0x0;
  if (!bVar5) {
    in_string._M_str = pcVar1;
    in_string._M_len = (size_t)local_50._M_dataplus._M_p;
    dVar6 = jessilib::decode_codepoint_utf8<char>((jessilib *)local_50._M_string_length,in_string);
    pcVar1 = (char *)dVar6.units;
    if (pcVar1 == (char *)0x0) {
      bVar5 = false;
    }
    else {
      do {
        local_50._M_string_length = local_50._M_string_length + -(long)pcVar1;
        bVar5 = (jessilib *)local_50._M_string_length == (jessilib *)0x0;
        if (bVar5) break;
        _Var4._M_p = _Var4._M_p + (long)pcVar1;
        in_string_00._M_str = pcVar1;
        in_string_00._M_len = (size_t)_Var4._M_p;
        dVar6 = jessilib::decode_codepoint_utf8<char>
                          ((jessilib *)local_50._M_string_length,in_string_00);
        pcVar1 = (char *)dVar6.units;
      } while (pcVar1 != (char *)0x0);
    }
  }
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_60[0] = bVar5;
  if (bVar5 == false) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_80,local_60,"is_valid(abcd_str)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x9e,(char *)local_80);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
    if (local_90 != (long *)0x0) {
      (**(code **)(*local_90 + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_80 = local_70;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)&local_80,_Var3._M_p,pcVar2);
  lhs_00._M_str = _Var3._M_p;
  lhs_00._M_len = (size_t)this_00;
  rhs_00._M_str = (char8_t *)local_80;
  rhs_00._M_len = (size_t)local_78._M_head_impl;
  local_60[0] = jessilib::equals<char,char8_t>(lhs_00,rhs_00);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pcVar2 = extraout_RDX_05;
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
    pcVar2 = extraout_RDX_06;
  }
  if (local_60[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_80,local_60,
               "equals(abcd_string_view, string_cast<typename TypeParam::second_type>(abcd_string_view))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xa1,(char *)local_80);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    pcVar2 = extraout_RDX_07;
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
      pcVar2 = extraout_RDX_08;
    }
    if (local_90 != (long *)0x0) {
      (**(code **)(*local_90 + 8))();
      pcVar2 = extraout_RDX_09;
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
    pcVar2 = extraout_RDX_10;
  }
  bVar5 = this_00 == (jessilib *)0x0;
  if (!bVar5) {
    in_string_01._M_str = pcVar2;
    in_string_01._M_len = (size_t)_Var3._M_p;
    dVar6 = jessilib::decode_codepoint_utf8<char>(this_00,in_string_01);
    pcVar2 = (char *)dVar6.units;
    if (pcVar2 == (char *)0x0) {
      bVar5 = false;
    }
    else {
      do {
        this_00 = this_00 + -(long)pcVar2;
        bVar5 = this_00 == (jessilib *)0x0;
        if (bVar5) break;
        _Var3._M_p = _Var3._M_p + (long)pcVar2;
        in_string_02._M_str = pcVar2;
        in_string_02._M_len = (size_t)_Var3._M_p;
        dVar6 = jessilib::decode_codepoint_utf8<char>(this_00,in_string_02);
        pcVar2 = (char *)dVar6.units;
      } while (pcVar2 != (char *)0x0);
    }
  }
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_60[0] = bVar5;
  if (bVar5 == false) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_80,local_60,"is_valid(abcd_string_view)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xa2,(char *)local_80);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
    if (local_90 != (long *)0x0) {
      (**(code **)(*local_90 + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, string_cast) {
	auto abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"ABCD");
	std::basic_string_view<typename TypeParam::first_type> abcd_string_view = abcd_str;

	EXPECT_TRUE(equals(abcd_str,
		string_cast<typename TypeParam::second_type>(abcd_str)));
	EXPECT_TRUE(is_valid(abcd_str));

	EXPECT_TRUE(equals(abcd_string_view,
		string_cast<typename TypeParam::second_type>(abcd_string_view)));
	EXPECT_TRUE(is_valid(abcd_string_view));
}